

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O2

RealType __thiscall OpenMD::Snapshot::getXYarea(Snapshot *this)

{
  Mat3x3d *this_00;
  RealType RVar1;
  Vector<double,_3U> VStack_68;
  Vector3d y;
  Vector3d x;
  
  if (this->hasXYarea == true) {
    RVar1 = (this->frameData).xyArea;
  }
  else {
    this_00 = &(this->frameData).hmat;
    RectMatrix<double,_3U,_3U>::getColumn
              (&y.super_Vector<double,_3U>,(RectMatrix<double,_3U,_3U> *)this_00,0);
    Vector<double,_3U>::Vector(&x.super_Vector<double,_3U>,&y.super_Vector<double,_3U>);
    RectMatrix<double,_3U,_3U>::getColumn(&VStack_68,(RectMatrix<double,_3U,_3U> *)this_00,1);
    Vector<double,_3U>::Vector(&y.super_Vector<double,_3U>,&VStack_68);
    cross<double>((Vector3<double> *)&VStack_68,(Vector3<double> *)&x.super_Vector<double,_3U>,
                  (Vector3<double> *)&y.super_Vector<double,_3U>);
    RVar1 = Vector<double,_3U>::length(&VStack_68);
    (this->frameData).xyArea = RVar1;
    this->hasXYarea = true;
  }
  return RVar1;
}

Assistant:

RealType Snapshot::getXYarea() {
    if (!hasXYarea) {
      Vector3d x       = frameData.hmat.getColumn(0);
      Vector3d y       = frameData.hmat.getColumn(1);
      frameData.xyArea = cross(x, y).length();
      hasXYarea        = true;
    }
    return frameData.xyArea;
  }